

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O3

void duckdb::StringDecompressFunction<unsigned_int>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  uint uVar2;
  idx_t count;
  uint *puVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  allocate_function_ptr_t p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_t *psVar7;
  byte bVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  SelectionVector *pSVar18;
  reference vector;
  VectorBuffer *pVVar19;
  ulong uVar20;
  TemplatedValidityData<unsigned_long> *pTVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  idx_t iVar23;
  idx_t iVar24;
  void *in_R9;
  idx_t idx_in_entry;
  ulong uVar25;
  data_ptr_t pdVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  optional_idx dict_size;
  undefined1 in_stack_ffffffffffffff48;
  undefined1 local_a8 [24];
  idx_t local_90;
  uint *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  undefined1 auVar28 [16];
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  ArenaAllocator::Reset((ArenaAllocator *)&(local_78.sel)->selection_data);
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = vector->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar7 = (string_t *)result->data;
    puVar3 = (uint *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_int,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_int_const&)_1_>
              (puVar3,psVar7,count,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff48);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(vector);
      pVVar19 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
      local_78.sel = (SelectionVector *)pVVar19[1].data.allocator.ptr;
      if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
         (iVar23 = optional_idx::GetIndex((optional_idx *)&local_78), iVar23 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(vector);
        pVVar19 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
        if (*(char *)&pVVar19[1]._vptr_VectorBuffer == '\0') {
          psVar7 = (string_t *)result->data;
          local_88 = (uint *)pVVar19[1].data.pointer;
          local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
          FlatVector::VerifyFlatVector((Vector *)(pVVar19 + 1));
          FlatVector::VerifyFlatVector(result);
          UnaryExecutor::
          ExecuteFlat<unsigned_int,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_int_const&)_1_>
                    (local_88,psVar7,local_90,(ValidityMask *)&pVVar19[1].data.allocated_size,
                     &result->validity,in_R9,(bool)in_stack_ffffffffffffff48);
          DictionaryVector::VerifyDictionary(vector);
          pVVar19 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
          iVar23 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar23,(SelectionVector *)(pVVar19 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar3 = (uint *)result->data;
      puVar4 = (uint *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      uVar2 = *puVar4;
      auVar29 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  uVar2 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar2 >> 0x10),uVar2)) >> 0x20),
                                                  uVar2) >> 0x18),(char)(uVar2 >> 8)),
                                 (ushort)(byte)uVar2) & 0xffffff00ffffff);
      auVar29 = pshuflw(auVar29,auVar29,0xdb);
      sVar9 = auVar29._0_2_;
      sVar10 = auVar29._2_2_;
      sVar11 = auVar29._4_2_;
      sVar12 = auVar29._6_2_;
      uVar13 = (uint)DAT_0136d160;
      *puVar3 = uVar2 & 0xff;
      puVar3[1] = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar29[6] - (0xff < sVar12),
                           CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar29[4] - (0xff < sVar11),
                                    CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar29[2] -
                                             (0xff < sVar10),
                                             (0 < sVar9) * (sVar9 < 0x100) * auVar29[0] -
                                             (0xff < sVar9)))) & uVar13;
      puVar3[2] = 0;
      puVar3[3] = 0;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar18 = local_78.sel;
    pdVar26 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        p_Var6 = (allocate_function_ptr_t)pSVar18->sel_vector;
        pdVar26 = pdVar26 + 8;
        iVar23 = 0;
        do {
          iVar24 = iVar23;
          if (p_Var6 != (allocate_function_ptr_t)0x0) {
            iVar24 = (idx_t)*(uint *)(p_Var6 + iVar23 * 4);
          }
          uVar2 = *(uint *)(local_78.data + iVar24 * 4);
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)
                                                  (uVar2 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar2 >> 0x10),uVar2)) >> 0x20),
                                                  uVar2) >> 0x18),
                                               CONCAT12((char)(uVar2 >> 8),(short)uVar2)) >> 0x10),
                               (short)uVar2) & 0xffff00ff00ff00ff;
          auVar29 = pshuflw(auVar29,auVar29,0xdb);
          sVar9 = auVar29._0_2_;
          sVar10 = auVar29._2_2_;
          sVar11 = auVar29._4_2_;
          *(uint *)(pdVar26 + -8) = uVar2 & 0xff;
          *(uint *)(pdVar26 + -4) =
               (uint)CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar29[4] - (0xff < sVar11),
                              CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar29[2] -
                                       (0xff < sVar10),
                                       (0 < sVar9) * (sVar9 < 0x100) * auVar29[0] - (0xff < sVar9)))
          ;
          pdVar26[0] = '\0';
          pdVar26[1] = '\0';
          pdVar26[2] = '\0';
          pdVar26[3] = '\0';
          pdVar26[4] = '\0';
          pdVar26[5] = '\0';
          pdVar26[6] = '\0';
          pdVar26[7] = '\0';
          iVar23 = iVar23 + 1;
          pdVar26 = pdVar26 + 0x10;
        } while (count != iVar23);
      }
    }
    else if (count != 0) {
      p_Var6 = (allocate_function_ptr_t)pSVar18->sel_vector;
      pdVar26 = pdVar26 + 8;
      uVar25 = 0;
      do {
        uVar20 = uVar25;
        if (p_Var6 != (allocate_function_ptr_t)0x0) {
          uVar20 = (ulong)*(uint *)(p_Var6 + uVar25 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar20 >> 6]
             >> (uVar20 & 0x3f) & 1) == 0) {
          _Var22._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var22._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_a8,&local_80);
            uVar16 = local_a8._0_8_;
            uVar17 = local_a8._8_8_;
            local_a8._0_16_ = (undefined1  [16])0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar16;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
              }
            }
            pTVar21 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var22._M_head_impl =
                 (pTVar21->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var22._M_head_impl;
          }
          bVar8 = (byte)uVar25 & 0x3f;
          _Var22._M_head_impl[uVar25 >> 6] =
               _Var22._M_head_impl[uVar25 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          uVar2 = *(uint *)(local_78.data + uVar20 * 4);
          auVar15._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
          auVar15[0] = (char)(uVar2 >> 0x18);
          auVar15._10_6_ = 0;
          auVar28._5_11_ = SUB1611(auVar15 << 0x30,5);
          auVar28[4] = (char)(uVar2 >> 0x10);
          auVar28._0_4_ = uVar2;
          auVar14._12_4_ = 0;
          auVar14._0_12_ = auVar28._4_12_;
          auVar27._3_13_ = SUB1613(auVar14 << 0x20,3);
          auVar27[2] = (char)(uVar2 >> 8);
          auVar27[0] = (byte)uVar2;
          auVar27[1] = 0;
          auVar29 = pshuflw(auVar27,auVar27,0xdb);
          sVar9 = auVar29._0_2_;
          sVar10 = auVar29._2_2_;
          sVar11 = auVar29._4_2_;
          *(uint *)(pdVar26 + -8) = uVar2 & 0xff;
          *(uint *)(pdVar26 + -4) =
               (uint)CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar29[4] - (0xff < sVar11),
                              CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar29[2] -
                                       (0xff < sVar10),
                                       (0 < sVar9) * (sVar9 < 0x100) * auVar29[0] - (0xff < sVar9)))
          ;
          pdVar26[0] = '\0';
          pdVar26[1] = '\0';
          pdVar26[2] = '\0';
          pdVar26[3] = '\0';
          pdVar26[4] = '\0';
          pdVar26[5] = '\0';
          pdVar26[6] = '\0';
          pdVar26[7] = '\0';
        }
        uVar25 = uVar25 + 1;
        pdVar26 = pdVar26 + 0x10;
      } while (count != uVar25);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}